

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O0

void __thiscall
check_arythmetic_operations_for_heat_maps::test_method
          (check_arythmetic_operations_for_heat_maps *this)

{
  pointer *__return_storage_ptr__;
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_5a0;
  basic_cstring<const_char> local_590;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_580;
  assertion_result local_560;
  basic_cstring<const_char> local_548;
  basic_cstring<const_char> local_538;
  undefined1 local_528 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  multiply_by_scalar_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  difference_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> sum_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  multiply_by_scalar;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> difference;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> sum;
  undefined1 local_180 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  undefined1 local_c0 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  check_arythmetic_operations_for_heat_maps *this_local;
  
  __return_storage_ptr__ =
       &p.heat_map.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Gudhi::Persistence_representations::create_Gaussian_filter
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)__return_storage_ptr__,0x1e,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_d8,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__);
  uVar3 = std::numeric_limits<unsigned_int>::max();
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0,"data/file_with_diagram",&local_d8,false,1000,0.0,1.0,uVar3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&sum.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&p.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar3 = std::numeric_limits<unsigned_int>::max();
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_180,"data/file_with_diagram_1",
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&sum.heat_map.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,false,1000,0.0,1.0,uVar3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&sum.heat_map.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::operator+
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&difference.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_180);
  Gudhi::Persistence_representations::operator-
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&multiply_by_scalar.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_180);
  Gudhi::Persistence_representations::operator*
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&sum_template.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,2.0,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&difference_template.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                  *)&difference_template.heat_map.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"data/heat_map_sum");
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&multiply_by_scalar_template.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                  *)&multiply_by_scalar_template.heat_map.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"data/heat_map_difference");
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_528);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                  *)local_528,"data/heat_map_multiply_by_scalar");
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_538,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
               ,0x89);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_548);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_538,0xc0,&local_548);
    bVar2 = Gudhi::Persistence_representations::
            Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
            operator==((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                        *)&difference.heat_map.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                        *)&difference_template.heat_map.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    boost::test_tools::assertion_result::assertion_result(&local_560,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,"sum == sum_template",0x13);
    boost::unit_test::operator<<(&local_580,prev,&local_590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
               ,0x89);
    boost::test_tools::tt_detail::report_assertion(&local_560,&local_580,&local_5a0,0xc0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_580);
    boost::test_tools::assertion_result::~assertion_result(&local_560);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_528);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&multiply_by_scalar_template.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&difference_template.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&sum_template.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&multiply_by_scalar.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )&difference.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_180);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&p.heat_map.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_arythmetic_operations_for_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(30, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);
  Persistence_heat_maps<constant_scaling_function> q("data/file_with_diagram_1", filter, false, 1000, 0, 1);

  Persistence_heat_maps<constant_scaling_function> sum = p + q;
  Persistence_heat_maps<constant_scaling_function> difference = p - q;
  Persistence_heat_maps<constant_scaling_function> multiply_by_scalar = 2 * p;

  // sum.print_to_file( "sum" );
  // difference.print_to_file( "difference" );
  // multiply_by_scalar.print_to_file( "multiply_by_scalar" );

  Persistence_heat_maps<constant_scaling_function> sum_template;
  sum_template.load_from_file("data/heat_map_sum");
  Persistence_heat_maps<constant_scaling_function> difference_template;
  difference_template.load_from_file("data/heat_map_difference");
  Persistence_heat_maps<constant_scaling_function> multiply_by_scalar_template;
  multiply_by_scalar_template.load_from_file("data/heat_map_multiply_by_scalar");

  BOOST_CHECK(sum == sum_template);
}